

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplitDeque.h
# Opt level: O1

pair<HighsSplitDeque::Status,_HighsTask_*> __thiscall HighsSplitDeque::pop(HighsSplitDeque *this)

{
  element_type *peVar1;
  bool bVar2;
  uint uVar3;
  uint32_t uVar4;
  undefined8 uVar5;
  HighsTask *pHVar6;
  pair<HighsSplitDeque::Status,_HighsTask_*> pVar7;
  
  uVar3 = (this->ownerData).head;
  if (uVar3 == 0) {
    return (pair<HighsSplitDeque::Status,_HighsTask_*>)ZEXT416(0);
  }
  if (0x2000 < uVar3) {
    (this->ownerData).head = uVar3 - 1;
    uVar5 = 3;
    pHVar6 = (HighsTask *)0x0;
    goto LAB_00227113;
  }
  if ((this->ownerData).allStolenCopy == true) {
LAB_0022709e:
    pHVar6 = (this->taskArray)._M_elems + (uVar3 - 1);
    uVar5 = 1;
  }
  else {
    if ((this->ownerData).splitCopy == uVar3) {
      bVar2 = shrinkShared(this);
      if (bVar2) {
        uVar3 = (this->ownerData).head;
        goto LAB_0022709e;
      }
    }
    uVar4 = (this->ownerData).head - 1;
    (this->ownerData).head = uVar4;
    if (uVar4 == 0) {
      if ((this->ownerData).allStolenCopy == false) {
        (this->ownerData).allStolenCopy = true;
        (this->stealerData).allStolen._M_base._M_i = true;
        peVar1 = (this->ownerData).workerBunk.
                 super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        LOCK();
        (peVar1->haveJobs).super___atomic_base<int>._M_i =
             (peVar1->haveJobs).super___atomic_base<int>._M_i + -1;
        UNLOCK();
      }
    }
    else if (uVar4 != (this->ownerData).splitCopy) {
      growShared(this);
    }
    pHVar6 = (this->taskArray)._M_elems + (this->ownerData).head;
    uVar5 = 2;
  }
LAB_00227113:
  pVar7.second = pHVar6;
  pVar7._0_8_ = uVar5;
  return pVar7;
}

Assistant:

std::pair<Status, HighsTask*> pop() {
    if (ownerData.head == 0) return std::make_pair(Status::kEmpty, nullptr);

    if (ownerData.head > kTaskArraySize) {
      // task queue was full and the overflown tasks have
      // been directly executed
      ownerData.head -= 1;
      return std::make_pair(Status::kOverflown, nullptr);
    }

    if (ownerData.allStolenCopy)
      return std::make_pair(Status::kStolen, &taskArray[ownerData.head - 1]);

    if (ownerData.splitCopy == ownerData.head) {
      if (shrinkShared())
        return std::make_pair(Status::kStolen, &taskArray[ownerData.head - 1]);
    }

    ownerData.head -= 1;

    if (ownerData.head == 0) {
      if (!ownerData.allStolenCopy) {
        ownerData.allStolenCopy = true;
        stealerData.allStolen.store(true, std::memory_order_relaxed);
        ownerData.workerBunk->haveJobs.fetch_add(-1, std::memory_order_release);
      }
    } else if (ownerData.head != ownerData.splitCopy)
      growShared();

    return std::make_pair(Status::kWork, &taskArray[ownerData.head]);
  }